

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::TextNode::~TextNode(TextNode *this)

{
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_00230658;
  std::__cxx11::string::~string((string *)&this->text);
  TemplateNode::~TemplateNode(&this->super_TemplateNode);
  return;
}

Assistant:

TextNode(const Location & loc, const std::string& t) : TemplateNode(loc), text(t) {}